

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<unsigned_long,_long>::Run
          (DataTransform<unsigned_long,_long> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  size_t *__idx;
  ulong uVar7;
  int iVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar11;
  undefined1 auVar12 [16];
  allocator local_289;
  istream *local_288;
  unsigned_long input_data;
  string *local_278;
  ulong local_270;
  unsigned_long local_268;
  ulong local_260;
  ulong local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_278 = &this->print_format_;
  iVar8 = 0;
  local_288 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(local_288,(string *)&word);
      if (word._M_string_length == 0) {
        bVar5 = false;
        bVar4 = true;
      }
      else {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        lVar9 = (longdouble)9.223372e+18;
        lVar10 = (longdouble)0;
        if (lVar9 <= in_ST0) {
          lVar10 = lVar9;
        }
        local_258 = (ulong)ROUND(in_ST0 - lVar10);
        input_data = (ulong)(lVar9 <= in_ST0) << 0x3f ^ local_258;
        bVar4 = false;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
      }
      std::__cxx11::string::~string((string *)&word);
      if (bVar5) goto LAB_0012c9ef;
      if (bVar4) {
        if (bVar4) {
LAB_0012cc04:
          bVar5 = true;
          if ((this->is_ascii_output_ == true) && (iVar8 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_0012cc26:
          bVar5 = false;
        }
        return bVar5;
      }
    }
    else {
      bVar5 = sptk::ReadStream<unsigned_long>(&input_data,local_288);
      if (!bVar5) goto LAB_0012cc04;
LAB_0012c9ef:
      uVar7 = this->minimum_value_;
      uVar3 = this->maximum_value_;
      if ((long)uVar7 < (long)uVar3) {
        NVar1 = this->input_numeric_type_;
        if (NVar1 == kFloatingPoint) {
          local_268 = input_data;
          local_260 = uVar7;
          if (((float)(long)uVar7 <=
               (float)(long)input_data +
               *(float *)(&DAT_00140b30 + (ulong)((long)input_data < 0) * 4)) &&
             (uVar7 = uVar3, local_270 = uVar3,
             (float)(long)input_data + *(float *)(&DAT_00140b30 + (ulong)((long)input_data < 0) * 4)
             <= (float)(long)uVar3)) goto LAB_0012ca9e;
        }
        else if (NVar1 == kUnsignedInteger) {
          if (uVar7 <= input_data) {
            bVar5 = uVar3 < input_data;
            uVar7 = uVar3;
            if (!bVar5) {
              uVar7 = input_data;
            }
            goto LAB_0012caa3;
          }
        }
        else {
          if (NVar1 != kSignedInteger) goto LAB_0012ca9e;
          if ((long)uVar7 <= (long)input_data) {
            bVar5 = (long)uVar3 < (long)input_data;
            uVar7 = uVar3;
            if ((long)input_data <= (long)uVar3) {
              uVar7 = input_data;
            }
            goto LAB_0012caa3;
          }
        }
LAB_0012cae3:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar8);
          std::operator<<(poVar6,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_289);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar2 == kExit) goto LAB_0012cc26;
        }
      }
      else {
LAB_0012ca9e:
        bVar5 = false;
        uVar7 = input_data;
LAB_0012caa3:
        if ((bVar5) || (this->rounding_ == false)) {
          if (bVar5) goto LAB_0012cae3;
        }
        else {
          auVar12._8_4_ = (int)(input_data >> 0x20);
          auVar12._0_8_ = input_data;
          auVar12._12_4_ = 0x45300000;
          dVar11 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)input_data) - 4503599627370496.0);
          if (input_data == 0) {
            dVar11 = dVar11 + -0.5;
          }
          else {
            dVar11 = dVar11 + 0.5;
          }
          uVar7 = (ulong)dVar11;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar5 = sptk::SnPrintf<long>(uVar7,local_278,0x80,buffer);
        if (!bVar5) goto LAB_0012cc26;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar8 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
        }
      }
      else {
        bVar5 = sptk::WriteStream<long>(uVar7,(ostream *)&std::cout);
        if (!bVar5) goto LAB_0012cc26;
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }